

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_array<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  pointer pcVar2;
  pointer peVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  undefined1 auVar7 [8];
  bool newline_found;
  value_type *v;
  error_type *peVar8;
  error_type *peVar9;
  value_type *pvVar10;
  value_type *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  error_info *peVar12;
  ulong uVar13;
  error_info *v_00;
  uint uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  basic_value<toml::type_config> *pbVar17;
  context<toml::type_config> *ctx_00;
  size_t sVar18;
  error_info *peVar19;
  _Alloc_hider _Var20;
  size_t sVar21;
  long lVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  long lVar24;
  bool bVar25;
  array_format_info fmt;
  optional<toml::detail::multiline_spacer<toml::type_config>_> spacer;
  array_type val;
  source_location src;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  location first;
  ulong local_8c8;
  undefined1 local_8b8 [32];
  bool local_898;
  long local_890;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  local_888;
  vector<toml::error_info,_std::allocator<toml::error_info>_> *local_870;
  undefined **local_868;
  undefined1 local_860 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_810;
  undefined8 local_800;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_7f8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_7b0;
  error_info local_790;
  undefined1 local_738 [56];
  _Alloc_hider local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_630;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  undefined1 local_558 [16];
  pointer local_548;
  array_type local_538;
  undefined1 local_520 [32];
  bool local_500;
  undefined1 local_4f8 [8];
  undefined1 auStack_4f0 [104];
  location local_488;
  undefined1 local_440 [16];
  _Alloc_hider local_430;
  char local_420 [16];
  size_t local_410;
  size_t local_408;
  size_t sStack_400;
  size_t local_3f8;
  size_t local_3f0;
  size_t sStack_3e8;
  size_t local_3e0;
  source_location local_3d8;
  source_location local_358;
  source_location local_2d8;
  failure<toml::error_info> local_258;
  basic_value<toml::type_config> local_200;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  basic_value<toml::type_config> *v_01;
  
  lVar22 = (long)(ctx->errors_).
                 super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ctx->errors_).
                 super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                 super__Vector_impl_data._M_start;
  location::location(&local_488,loc);
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar16 = loc->location_;
  lVar24 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  uVar13 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - lVar24;
  if ((uVar16 < uVar13) && (*(char *)(lVar24 + uVar16) == '[')) {
    if (uVar16 + 1 < uVar13) {
      loc->column_number_ = loc->column_number_ + 1;
      uVar13 = uVar16 + 1;
    }
    else {
      sVar18 = loc->line_number_;
      sVar21 = loc->column_number_;
      do {
        if (*(char *)(lVar24 + uVar16) == '\n') {
          sVar18 = sVar18 + 1;
          loc->line_number_ = sVar18;
          sVar21 = 1;
        }
        else {
          sVar21 = sVar21 + 1;
        }
        loc->column_number_ = sVar21;
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    loc->location_ = uVar13;
    local_888.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_888.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_888.
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    skip_multiline_spacer<toml::type_config>
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_8b8,loc,ctx,
               false);
    local_8c8 = 0x400000202;
    if ((local_898 & local_8b8[0]) == 0) {
      local_8c8 = 0x400000201;
    }
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    peVar12 = (error_info *)loc->location_;
    lVar24 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    v_00 = (error_info *)
           ((peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish + -lVar24);
    uVar14 = 0;
    if (peVar12 < v_00) {
      local_870 = &ctx->errors_;
      bVar25 = true;
      local_868 = &PTR__scanner_base_005558a0;
      local_890 = lVar22;
      do {
        if (*(char *)((long)&(peVar12->title_)._M_dataplus._M_p + lVar24) == ']') {
          if (local_898 == true) {
            lVar22 = local_890;
            uVar14 = 0;
            if (((bool)local_8b8[0] == true) && (uVar14 = 0, local_8b8[1] != none)) {
              local_8c8 = local_8c8 & 0xffffffffffff00ff | (ulong)(byte)local_8b8[1] << 8;
              uVar14 = local_8b8._4_4_;
            }
            goto LAB_003bcb61;
          }
          break;
        }
        if (!bVar25) {
          region::region((region *)local_6e0,loc);
          source_location::source_location((source_location *)local_860,(region *)local_6e0);
          region::~region((region *)local_6e0);
          local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5b8,
                     "toml::parse_array: expected value-separator `,` or closing `]`","");
          local_358.file_name_._M_dataplus._M_p = (pointer)&local_358.file_name_.field_2;
          local_358.last_offset_._0_4_ = local_860._48_4_;
          local_358.last_offset_._4_4_ = local_860._52_4_;
          local_358.length_._0_4_ = local_860._56_4_;
          local_358.length_._4_4_ = local_860._60_4_;
          local_358.last_line_ = local_860._32_8_;
          local_358.last_column_ = local_860._40_8_;
          local_358.first_column_ = local_860._16_8_;
          local_358.first_offset_ = local_860._24_8_;
          local_358.first_line_ = local_860._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._64_8_ == &local_810) {
            local_358.file_name_.field_2._8_8_ = local_810._8_8_;
          }
          else {
            local_358.file_name_._M_dataplus._M_p = (pointer)local_860._64_8_;
          }
          local_358.file_name_._M_string_length = local_860._72_8_;
          local_860._72_8_ = 0;
          local_810._M_local_buf[0] = '\0';
          local_358.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_800;
          local_358.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7f8[0]._0_8_;
          local_358.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7f8[0]._8_8_;
          _local_800 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )ZEXT816(0);
          aaStack_7f8[0]._8_8_ = (pointer)0x0;
          local_860._64_8_ = &local_810;
          local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"here","");
          make_error_info<>((error_info *)local_6e0,&local_5b8,&local_358,&local_5d8);
          err<toml::error_info>(&local_e0,(error_info *)local_6e0);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0
                    );
          failure<toml::error_info>::~failure(&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d0._40_8_ != local_698) {
            operator_delete((void *)local_6d0._40_8_,local_698[0]._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_6d0 + 0x10));
          if ((element_type *)local_6e0._0_8_ != (element_type *)local_6d0) {
            operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location(&local_358);
          _Var20._M_p = local_5b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) goto LAB_003bcdb2;
          goto LAB_003bcdba;
        }
        if (((local_898 == true) && ((bool)local_8b8[0] == true)) && (local_8b8[1] != none)) {
          local_8c8 = (ulong)((uint)local_8c8 & 0xffff00ff) | (ulong)(byte)local_8b8[1] << 8 |
                      (ulong)(uint)local_8b8._4_4_ << 0x20;
        }
        paVar23 = &local_790.suffix_.field_2;
        paVar15 = &local_790.title_.field_2;
        parse_value<toml::type_config>
                  ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_860,loc,
                   ctx);
        if (local_860[0] == true) {
          v = result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap
                        ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_860
                         ,(source_location)0x556408);
          basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_6e0,v)
          ;
          pbVar6 = local_630.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar5 = local_630.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = local_630.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_898 == true) {
            local_630.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_8b8._24_8_;
            local_630.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8b8._8_8_;
            local_630.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_8b8._16_8_;
            local_4f8 = (undefined1  [8])pbVar4;
            auStack_4f0._0_8_ = pbVar5;
            auStack_4f0._8_8_ = pbVar6;
            local_8b8._8_16_ = (undefined1  [16])0x0;
            local_8b8._24_8_ = (pointer)0x0;
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4f8);
          }
          skip_multiline_spacer<toml::type_config>
                    ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_4f8,loc,
                     ctx,false);
          std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
          _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                          *)local_8b8,
                         (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                          *)local_4f8);
          if (auStack_4f0[0x18] == '\x01') {
            auStack_4f0[0x18] = '\0';
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_4f0);
          }
          if (local_898 == true) {
            uVar16 = 0xffffffffffffffff;
            lVar24 = 0;
            while( true ) {
              uVar16 = uVar16 + 1;
              if ((ulong)((long)(local_8b8._16_8_ - local_8b8._8_8_) >> 5) <= uVar16) break;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_630,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_8b8._8_8_)->_M_p + lVar24));
              lVar24 = lVar24 + 0x20;
              if (local_898 == false) {
                std::__throw_bad_optional_access();
              }
            }
            if ((bool)local_8b8[0] == true) {
              local_8c8 = local_8c8 & 0xffffffffffffff00 | 2;
            }
          }
          local_520._0_8_ = local_868;
          local_520[8] = 0x2c;
          character::scan((region *)local_4f8,(character *)local_520,loc);
          auVar7 = local_4f8;
          bVar25 = local_4f8 != (undefined1  [8])0x0;
          region::~region((region *)local_4f8);
          parse_comment_line<toml::type_config>
                    ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      *)local_4f8,loc,ctx);
          if (local_4f8[0] == false) {
            peVar9 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                     ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                   *)local_4f8,(source_location)0x556420);
            local_738._0_8_ = local_738 + 0x10;
            pcVar2 = (peVar9->title_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_738,pcVar2,pcVar2 + (peVar9->title_)._M_string_length);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_738 + 0x20),&peVar9->locations_);
            local_700._M_p = (pointer)&local_6f0;
            pcVar2 = (peVar9->suffix_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_700,pcVar2,pcVar2 + (peVar9->suffix_)._M_string_length);
            std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
            emplace_back<toml::error_info>(local_870,(error_info *)local_738);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_700._M_p != &local_6f0) {
              operator_delete(local_700._M_p,local_6f0._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_738 + 0x20));
            if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
              operator_delete((void *)local_738._0_8_,local_738._16_8_ + 1);
            }
          }
          if ((local_4f8[0] == true) &&
             (pvVar10 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                  *)local_4f8,(source_location)0x556438),
             (pvVar10->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged == true)) {
            __x = (value_type *)
                  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                            *)local_4f8,(source_location)0x556450);
            if (*(char *)&__x[1]._M_dataplus._M_p == '\0') {
              std::__throw_bad_optional_access();
            }
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_630,__x);
            local_8c8 = local_8c8 & 0xffffffffffffff00 | 2;
            newline_found = true;
          }
          else {
            newline_found = false;
          }
          if (auVar7 != (undefined1  [8])0x0) {
            skip_multiline_spacer<toml::type_config>
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_520,loc
                       ,ctx,newline_found);
            std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
            _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                            *)local_8b8,
                           (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                            *)local_520);
            if (local_500 == true) {
              local_500 = false;
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_520 + 8));
            }
            if ((local_898 == true) && ((bool)local_8b8[0] == true)) {
              local_8c8 = local_8c8 & 0xffffffffffffff00 | 2;
            }
          }
          pbVar17 = (basic_value<toml::type_config> *)local_6e0;
          std::
          vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
          ::emplace_back<toml::basic_value<toml::type_config>>
                    ((vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>
                      *)&local_888,pbVar17);
          result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                     *)local_4f8,(EVP_PKEY_CTX *)pbVar17);
          basic_value<toml::type_config>::cleanup
                    ((basic_value<toml::type_config> *)local_6e0,(EVP_PKEY_CTX *)pbVar17);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_630);
          region::~region((region *)local_698);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::cleanup
                    ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_860,
                     (EVP_PKEY_CTX *)pbVar17);
        }
        else {
          peVar8 = result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap_err
                             ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                              local_860,(source_location)0x556468);
          local_790.title_._M_dataplus._M_p = (peVar8->title_)._M_dataplus._M_p;
          paVar11 = &(peVar8->title_).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790.title_._M_dataplus._M_p == paVar11) {
            local_790.title_.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_790.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar8->title_).field_2 + 8);
            local_790.title_._M_dataplus._M_p = (pointer)paVar15;
          }
          else {
            local_790.title_.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_790.title_._M_string_length = (peVar8->title_)._M_string_length;
          (peVar8->title_)._M_dataplus._M_p = (pointer)paVar11;
          (peVar8->title_)._M_string_length = 0;
          (peVar8->title_).field_2._M_local_buf[0] = '\0';
          local_790.locations_.
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (peVar8->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_790.locations_.
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (peVar8->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_790.locations_.
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (peVar8->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (peVar8->locations_).
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (peVar8->locations_).
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (peVar8->locations_).
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_790.suffix_._M_dataplus._M_p = (peVar8->suffix_)._M_dataplus._M_p;
          paVar11 = &(peVar8->suffix_).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790.suffix_._M_dataplus._M_p == paVar11) {
            local_790.suffix_.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_790.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(peVar8->suffix_).field_2 + 8);
            local_790.suffix_._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_790.suffix_.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_790.suffix_._M_string_length = (peVar8->suffix_)._M_string_length;
          (peVar8->suffix_)._M_dataplus._M_p = (pointer)paVar11;
          (peVar8->suffix_)._M_string_length = 0;
          (peVar8->suffix_).field_2._M_local_buf[0] = '\0';
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(local_870,&local_790);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790.suffix_._M_dataplus._M_p != paVar23) {
            operator_delete(local_790.suffix_._M_dataplus._M_p,
                            local_790.suffix_.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_790.locations_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790.title_._M_dataplus._M_p != paVar15) {
            operator_delete(local_790.title_._M_dataplus._M_p,
                            local_790.title_.field_2._M_allocated_capacity + 1);
          }
          sVar18 = loc->location_;
          ctx_00 = ctx;
          skip_value<toml::type_config>(loc,ctx);
          sVar21 = loc->location_;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::cleanup
                    ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_860,
                     (EVP_PKEY_CTX *)ctx_00);
          bVar25 = true;
          if (sVar18 == sVar21) {
            peVar1 = (loc->source_).
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            peVar12 = (error_info *)loc->location_;
            lVar24 = (long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
            v_00 = (error_info *)
                   ((peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish + -lVar24);
            break;
          }
        }
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        peVar12 = (error_info *)loc->location_;
        lVar24 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        v_00 = (error_info *)
               ((peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish + -lVar24);
      } while (peVar12 < v_00);
      lVar22 = local_890;
      uVar14 = 0;
    }
LAB_003bcb61:
    if ((peVar12 < v_00) && (*(char *)((long)&(peVar12->title_)._M_dataplus._M_p + lVar24) == ']'))
    {
      peVar19 = (error_info *)((long)&(peVar12->title_)._M_dataplus._M_p + 1);
      if (peVar19 < v_00) {
        loc->column_number_ = loc->column_number_ + 1;
      }
      else {
        sVar18 = loc->line_number_;
        sVar21 = loc->column_number_;
        do {
          if (*(char *)((long)&(peVar12->title_)._M_dataplus._M_p + lVar24) == '\n') {
            sVar18 = sVar18 + 1;
            loc->line_number_ = sVar18;
            sVar21 = 1;
          }
          else {
            sVar21 = sVar21 + 1;
          }
          loc->column_number_ = sVar21;
          peVar12 = (error_info *)((long)&(peVar12->title_)._M_dataplus._M_p + 1);
          peVar19 = v_00;
        } while (v_00 != peVar12);
      }
      loc->location_ = (size_t)peVar19;
      peVar3 = (ctx->errors_).
               super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (lVar22 == (long)peVar3 -
                    (long)(ctx->errors_).
                          super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
                          _M_impl.super__Vector_impl_data._M_start) {
        local_538.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_888.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_538.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_888.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_538.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_888.
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_888.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_888.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_888.
        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_558 = (undefined1  [16])0x0;
        local_548 = (pointer)0x0;
        local_440._0_8_ =
             local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_440._8_8_ =
             local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_488.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_488.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_488.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_488.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_430._M_p = local_420;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_430,local_488.source_name_._M_dataplus._M_p,
                   local_488.source_name_._M_dataplus._M_p + local_488.source_name_._M_string_length
                  );
        local_408 = local_488.location_;
        sStack_400 = local_488.line_number_;
        local_3f8 = local_488.column_number_;
        local_3f0 = loc->location_;
        sStack_3e8 = loc->line_number_;
        local_410 = local_3f0 - local_488.location_;
        local_3e0 = loc->column_number_;
        fmt.closing_indent = uVar14;
        fmt.fmt = (char)local_8c8;
        fmt.indent_type = (char)(local_8c8 >> 8);
        fmt._2_2_ = (short)(local_8c8 >> 0x10);
        fmt.body_indent = (int)(local_8c8 >> 0x20);
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_860,&local_538,fmt,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_558,(region_type *)local_440);
        ok<toml::basic_value<toml::type_config>>
                  ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_860,
                   v_01);
        __return_storage_ptr__->is_ok_ = true;
        pbVar17 = &local_200;
        basic_value<toml::type_config>::basic_value
                  (&(__return_storage_ptr__->field_1).succ_.value,&local_200);
        basic_value<toml::type_config>::cleanup(&local_200,(EVP_PKEY_CTX *)pbVar17);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_200.comments_);
        region::~region(&local_200.region_);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_860,(EVP_PKEY_CTX *)pbVar17);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_7b0);
        region::~region((region *)(local_860 + 0x48));
        region::~region((region *)local_440);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_558);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::~vector(&local_538);
      }
      else {
        err<toml::error_info_const&>(&local_258,(toml *)(peVar3 + -1),v_00);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_258)
        ;
        failure<toml::error_info>::~failure(&local_258);
      }
    }
    else {
      region::region((region *)local_6e0,loc);
      source_location::source_location((source_location *)local_860,(region *)local_6e0);
      region::~region((region *)local_6e0);
      local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5f8,"toml::parse_array: missing closing bracket `]`","");
      local_3d8.file_name_._M_dataplus._M_p = (pointer)&local_3d8.file_name_.field_2;
      local_3d8.last_offset_._0_4_ = local_860._48_4_;
      local_3d8.last_offset_._4_4_ = local_860._52_4_;
      local_3d8.length_._0_4_ = local_860._56_4_;
      local_3d8.length_._4_4_ = local_860._60_4_;
      local_3d8.last_line_ = local_860._32_8_;
      local_3d8.last_column_ = local_860._40_8_;
      local_3d8.first_column_ = local_860._16_8_;
      local_3d8.first_offset_ = local_860._24_8_;
      local_3d8.first_line_ = local_860._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_860._64_8_ == &local_810) {
        local_3d8.file_name_.field_2._8_8_ = local_810._8_8_;
      }
      else {
        local_3d8.file_name_._M_dataplus._M_p = (pointer)local_860._64_8_;
      }
      local_3d8.file_name_._M_string_length = local_860._72_8_;
      local_860._72_8_ = 0;
      local_810._M_local_buf[0] = '\0';
      local_3d8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_800;
      local_3d8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7f8[0]._0_8_;
      local_3d8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7f8[0]._8_8_;
      _local_800 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )0x0;
      aaStack_7f8[0]._8_8_ = (pointer)0x0;
      local_860._64_8_ = &local_810;
      local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_618,"expected `]`, reached EOF","");
      make_error_info<>((error_info *)local_6e0,&local_5f8,&local_3d8,&local_618);
      err<toml::error_info>(&local_138,(error_info *)local_6e0);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d0._40_8_ != local_698) {
        operator_delete((void *)local_6d0._40_8_,local_698[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_6d0 + 0x10));
      if ((element_type *)local_6e0._0_8_ != (element_type *)local_6d0) {
        operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_3d8);
      local_5b8.field_2._M_allocated_capacity = local_5f8.field_2._M_allocated_capacity;
      _Var20._M_p = local_5f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
LAB_003bcdb2:
        operator_delete(_Var20._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
LAB_003bcdba:
      source_location::~source_location((source_location *)local_860);
    }
    if (local_898 == true) {
      local_898 = false;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_8b8 + 8));
    }
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::~vector(&local_888);
  }
  else {
    region::region((region *)local_6e0,loc);
    source_location::source_location((source_location *)local_860,(region *)local_6e0);
    region::~region((region *)local_6e0);
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_578,"toml::parse_array: The next token is not an array","");
    local_2d8.file_name_._M_dataplus._M_p = (pointer)&local_2d8.file_name_.field_2;
    local_2d8.last_offset_._0_4_ = local_860._48_4_;
    local_2d8.last_offset_._4_4_ = local_860._52_4_;
    local_2d8.length_._0_4_ = local_860._56_4_;
    local_2d8.length_._4_4_ = local_860._60_4_;
    local_2d8.last_line_ = local_860._32_8_;
    local_2d8.last_column_ = local_860._40_8_;
    local_2d8.first_column_ = local_860._16_8_;
    local_2d8.first_offset_ = local_860._24_8_;
    local_2d8.first_line_ = local_860._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._64_8_ == &local_810) {
      local_2d8.file_name_.field_2._8_8_ = local_810._8_8_;
    }
    else {
      local_2d8.file_name_._M_dataplus._M_p = (pointer)local_860._64_8_;
    }
    local_2d8.file_name_._M_string_length = local_860._72_8_;
    local_860._72_8_ = 0;
    local_810._M_local_buf[0] = '\0';
    local_2d8.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_800;
    local_2d8.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7f8[0]._0_8_;
    local_2d8.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7f8[0]._8_8_;
    _local_800 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
    aaStack_7f8[0]._8_8_ = (pointer)0x0;
    local_860._64_8_ = &local_810;
    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"here","");
    make_error_info<>((error_info *)local_6e0,&local_578,&local_2d8,&local_598);
    err<toml::error_info>(&local_88,(error_info *)local_6e0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._40_8_ != local_698) {
      operator_delete((void *)local_6d0._40_8_,local_698[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_6d0 + 0x10));
    if ((element_type *)local_6e0._0_8_ != (element_type *)local_6d0) {
      operator_delete((void *)local_6e0._0_8_,(ulong)(local_6d0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_860);
  }
  location::~location(&local_488);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_array(location& loc, context<TC>& ctx)
{
    const auto num_errors = ctx.errors().size();

    const auto first = loc;

    if(loc.eof() || loc.current() != '[')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: "
                "The next token is not an array", std::move(src), "here"));
    }
    loc.advance();

    typename basic_value<TC>::array_type val;

    array_format_info fmt;
    fmt.fmt = array_format::oneline;
    fmt.indent_type = indent_char::none;

    auto spacer = skip_multiline_spacer(loc, ctx);
    if(spacer.has_value() && spacer.value().newline_found)
    {
        fmt.fmt = array_format::multiline;
    }

    bool comma_found = true;
    while( ! loc.eof())
    {
        if(loc.current() == location::char_type(']'))
        {
            if(spacer.has_value() && spacer.value().newline_found &&
                spacer.value().indent_type != indent_char::none)
            {
                fmt.indent_type    = spacer.value().indent_type;
                fmt.closing_indent = spacer.value().indent;
            }
            break;
        }

        if( ! comma_found)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_array: "
                    "expected value-separator `,` or closing `]`",
                    std::move(src), "here"));
        }

        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        if(auto elem_res = parse_value(loc, ctx))
        {
            auto elem = std::move(elem_res.unwrap());

            if(spacer.has_value()) // copy previous comments to value
            {
                elem.comments() = std::move(spacer.value().comments);
            }

            // parse spaces between a value and a comma
            // array = [
            //     42    , # the answer
            //       ^^^^
            //     3.14 # pi
            //   , 2.71 ^^^^
            // ^^
            spacer = skip_multiline_spacer(loc, ctx);
            if(spacer.has_value())
            {
                for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                {
                    elem.comments().push_back(std::move(spacer.value().comments.at(i)));
                }
                if(spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }

            comma_found = character(',').scan(loc).is_ok();

            // parse comment after a comma
            // array = [
            //     42    , # the answer
            //             ^^^^^^^^^^^^
            //     3.14 # pi
            //          ^^^^
            // ]
            auto com_res = parse_comment_line(loc, ctx);
            if(com_res.is_err())
            {
                ctx.report_error(com_res.unwrap_err());
            }

            const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
            if(comment_found)
            {
                fmt.fmt = array_format::multiline;
                elem.comments().push_back(com_res.unwrap().value());
            }
            if(comma_found)
            {
                spacer = skip_multiline_spacer(loc, ctx, comment_found);
                if(spacer.has_value() && spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }
            val.push_back(std::move(elem));
        }
        else
        {
            // if err, push error to ctx and try recovery.
            ctx.report_error(std::move(elem_res.unwrap_err()));

            // if it looks like some value, then skip the value.
            // otherwise, it may be a new key-value pair or a new table and
            // the error is "missing closing ]". stop parsing.

            const auto before_skip = loc.get_location();
            skip_value(loc, ctx);
            if(before_skip == loc.get_location()) // cannot skip! break...
            {
                break;
            }
        }
    }

    if(loc.current() != ']')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: missing closing bracket `]`",
            std::move(src), "expected `]`, reached EOF"));
    }
    else
    {
        loc.advance();
    }
    // any error reported from this function
    if(num_errors != ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.errors().back());
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, region(first, loc)
        ));
}